

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ostream *poVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  void *pvVar8;
  undefined4 *memory;
  float fVar9;
  float fVar10;
  float fVar11;
  vector<int,_AO::Allocator::Version_1::ThreadSafeStackAllocator<int,_256UL,_void>_> tssv;
  vector<int,_AO::Allocator::Version_1::StackAllocator<int,_256UL,_void>_> sv;
  _Vector_impl local_378;
  _Vector_impl local_348;
  Stack<8UL> local_318 [4];
  undefined8 local_48;
  undefined1 local_40;
  long *plVar7;
  
  std::_Vector_base<int,_AO::Allocator::Version_1::StackAllocator<int,_256UL,_void>_>::_Vector_impl
  ::_Vector_impl(&local_348);
  std::_Vector_base<int,_AO::Allocator::Version_1::ThreadSafeStackAllocator<int,_256UL,_void>_>::
  _Vector_impl::_Vector_impl(&local_378);
  lVar4 = std::chrono::_V2::system_clock::now();
  lVar5 = std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Classic:               ",0x17);
  fVar9 = (float)(lVar5 - lVar4) / 1e+09;
  poVar6 = std::ostream::_M_insert<double>((double)fVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"s",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  local_48 = 0;
  local_318[0].super_IStack._vptr_IStack = (_func_int **)&PTR__IStack_00109c88;
  local_40 = 0;
  lVar5 = 10000000;
  lVar4 = std::chrono::_V2::system_clock::now();
  do {
    iVar1 = (*local_318[0].super_IStack._vptr_IStack[6])(local_318,8,8);
    *(undefined8 *)CONCAT44(extraout_var,iVar1) = 0x3ff0000000000000;
    iVar2 = (*local_318[0].super_IStack._vptr_IStack[6])(local_318,4,4);
    *(undefined4 *)CONCAT44(extraout_var_00,iVar2) = 2;
    iVar3 = (*local_318[0].super_IStack._vptr_IStack[6])(local_318,0x20,8);
    plVar7 = (long *)CONCAT44(extraout_var_01,iVar3);
    *plVar7 = (long)(plVar7 + 2);
    *(undefined2 *)(plVar7 + 2) = 0x33;
    plVar7[1] = 1;
    (*local_318[0].super_IStack._vptr_IStack[7])(local_318,plVar7,0x20);
    (*local_318[0].super_IStack._vptr_IStack[7])
              (local_318,(undefined4 *)CONCAT44(extraout_var_00,iVar2),4);
    (*local_318[0].super_IStack._vptr_IStack[7])
              (local_318,(undefined8 *)CONCAT44(extraout_var,iVar1),8);
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  lVar5 = std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Thread-Safe Allocator: ",0x17);
  fVar10 = (float)(lVar5 - lVar4) / 1e+09;
  poVar6 = std::ostream::_M_insert<double>((double)fVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"s",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  local_318[0].super_IStack._vptr_IStack = (_func_int **)&PTR__IStack_00109d08;
  local_48 = 0;
  lVar5 = 10000000;
  lVar4 = std::chrono::_V2::system_clock::now();
  do {
    iVar1 = (*local_318[0].super_IStack._vptr_IStack[6])(local_318,8,8);
    *(undefined8 *)CONCAT44(extraout_var_02,iVar1) = 0x3ff0000000000000;
    iVar2 = (*local_318[0].super_IStack._vptr_IStack[6])(local_318,4,4);
    *(undefined4 *)CONCAT44(extraout_var_03,iVar2) = 2;
    iVar3 = (*local_318[0].super_IStack._vptr_IStack[6])(local_318,0x20,8);
    plVar7 = (long *)CONCAT44(extraout_var_04,iVar3);
    *plVar7 = (long)(plVar7 + 2);
    *(undefined2 *)(plVar7 + 2) = 0x33;
    plVar7[1] = 1;
    (*local_318[0].super_IStack._vptr_IStack[7])(local_318,plVar7,0x20);
    (*local_318[0].super_IStack._vptr_IStack[7])
              (local_318,(undefined4 *)CONCAT44(extraout_var_03,iVar2),4);
    (*local_318[0].super_IStack._vptr_IStack[7])
              (local_318,(undefined8 *)CONCAT44(extraout_var_02,iVar1),8);
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  lVar5 = std::chrono::_V2::system_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Unsafe Allocator:      ",0x17);
  fVar11 = (float)(lVar5 - lVar4) / 1e+09;
  poVar6 = std::ostream::_M_insert<double>((double)fVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"s",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if ((fVar9 <= fVar10) || (fVar10 <= fVar11)) {
    __assert_fail("unsafeDuration < threadSafeDuration && threadSafeDuration < classicDuration && \"Allocator is too slow\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/herpec-j[P]StackAllocator/StackAllocator/Sources/Test.cpp"
                  ,0x49,"int main()");
  }
  local_318[0].super_IStack._vptr_IStack = (_func_int **)&PTR__IStack_00109d58;
  local_318[0].buffer[0]._0_4_ = 1;
  local_318[0].buffer[4]._0_2_ = 2;
  local_318[0].bufferSize = 8;
  local_318[0].buffer[6]._0_2_ = 3;
  pvVar8 = malloc(0x10);
  memory = (undefined4 *)((long)pvVar8 + 0xcU & 0xfffffffffffffffc);
  *(void **)(memory + -2) = pvVar8;
  *memory = 4;
  AO::Allocator::Version_1::Stack<8UL>::deallocate(local_318,memory,4);
  if (local_318[0].bufferSize != 8) {
    __assert_fail("!fa.empty() && fa.size() == fa.capacity() && \"Allocator should still be full (because the last element was out of stack bounds)\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/herpec-j[P]StackAllocator/StackAllocator/Sources/Test.cpp"
                  ,0x59,"int main()");
  }
  (*local_318[0].super_IStack._vptr_IStack[7])(local_318,local_318[0].buffer + 6,2);
  if (local_318[0].bufferSize == 6) {
    (*local_318[0].super_IStack._vptr_IStack[7])(local_318,local_318[0].buffer + 4,2);
    if (local_318[0].bufferSize != 4) {
      __assert_fail("!fa.empty() && fa.size() == sizeof(int) && \"Allocator should contain 1 element\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/herpec-j[P]StackAllocator/StackAllocator/Sources/Test.cpp"
                    ,0x5f,"int main()");
    }
    (*local_318[0].super_IStack._vptr_IStack[7])(local_318,local_318[0].buffer,4);
    if (local_318[0].bufferSize == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Success!",8);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
      std::_Vector_base<int,_AO::Allocator::Version_1::ThreadSafeStackAllocator<int,_256UL,_void>_>
      ::~_Vector_base((_Vector_base<int,_AO::Allocator::Version_1::ThreadSafeStackAllocator<int,_256UL,_void>_>
                       *)&local_378);
      std::_Vector_base<int,_AO::Allocator::Version_1::StackAllocator<int,_256UL,_void>_>::
      ~_Vector_base((_Vector_base<int,_AO::Allocator::Version_1::StackAllocator<int,_256UL,_void>_>
                     *)&local_348);
      return 0;
    }
    __assert_fail("fa.empty() && fa.size() == 0 && \"Allocator should be empty\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/herpec-j[P]StackAllocator/StackAllocator/Sources/Test.cpp"
                  ,0x62,"int main()");
  }
  __assert_fail("!fa.empty() && fa.size() == sizeof(int) + sizeof(short) && \"Allocator should contain 2 elements\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/herpec-j[P]StackAllocator/StackAllocator/Sources/Test.cpp"
                ,0x5c,"int main()");
}

Assistant:

int main(void)
{
	std::vector<int, AO::Allocator::StackAllocator<int>> sv;
	std::vector<int, AO::Allocator::ThreadSafeStackAllocator<int>> tssv;
	float const classicDuration = testClassic();
	float const threadSafeDuration = testThreadSafeAllocator();
	float const unsafeDuration = testUnsafeAllocator();
	assert(unsafeDuration < threadSafeDuration && threadSafeDuration < classicDuration && "Allocator is too slow");
	AO::Allocator::Stack<2 * sizeof(short) + sizeof(int)> fa;
	assert(fa.empty() && fa.size() == 0 && "Allocator should be empty");
	int *const value1 = fa.create<int>(1);
	assert(*value1 == 1 && "Object not constructed properly");
	assert(!fa.empty() && fa.size() == sizeof(int) && "Allocator should contain 1 element");
	short *const value2 = fa.create<short>(2);
	assert(*value2 == 2 && "Object not constructed properly");
	assert(!fa.empty() && fa.size() == sizeof(int) + sizeof(short) && "Allocator should contain 2 elements");
	short *const value3 = fa.create<short>(3);
	assert(*value3 == 3 && "Object not constructed properly");
	assert(!fa.empty() && fa.size() == fa.capacity() && "Allocator should be full");
	int *const value4 = fa.create<int>(4);
	assert(*value4 == 4 && "Object not constructed properly");
	assert(!fa.empty() && fa.size() == fa.capacity() && "Allocator should be full");
	fa.destroy(value4);
	assert(!fa.empty() && fa.size() == fa.capacity() && "Allocator should still be full (because the last element was out of stack bounds)");
	fa.destroy(value3);
	//assert(*value3 == 0 && "Object not destructed properly");
	assert(!fa.empty() && fa.size() == sizeof(int) + sizeof(short) && "Allocator should contain 2 elements");
	fa.destroy(value2);
	//assert(*value2 == 0 && "Object not destructed properly");
	assert(!fa.empty() && fa.size() == sizeof(int) && "Allocator should contain 1 element");
	fa.destroy(value1);
	//assert(*value1 == 0 && "Object not destructed properly");
	assert(fa.empty() && fa.size() == 0 && "Allocator should be empty");
	std::cout << "Success!" << std::endl;
	return 0;
}